

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeView.cc
# Opt level: O2

ostream * operator<<(ostream *os,NodeView *nv)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"NodeView: Node ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1," in ");
  std::operator<<(poVar1,(string *)&nv->dg->name);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const NodeView &nv) {
    os << "NodeView: Node "<<nv.id<<" in "<<nv.dg->name;
    return os;
}